

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# b_bot.cpp
# Opt level: O3

void Cmd_freeze(FCommandLine *argv,APlayerPawn *who,int key)

{
  bool bVar1;
  
  bVar1 = CheckCheatmode(true);
  if (bVar1) {
    return;
  }
  if ((netgame == true) && ((&DAT_017e1fd1)[(long)consoleplayer * 0x2a0] == '\0')) {
    Printf("Only setting controllers can use freeze mode\n");
    return;
  }
  Net_WriteByte('\n');
  Net_WriteByte('%');
  return;
}

Assistant:

CCMD (freeze)
{
	if (CheckCheatmode ())
		return;

	if (netgame && !players[consoleplayer].settings_controller)
	{
		Printf ("Only setting controllers can use freeze mode\n");
		return;
	}

	Net_WriteByte (DEM_GENERICCHEAT);
	Net_WriteByte (CHT_FREEZE);
}